

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixMutex_Lock(PaUnixMutex *self)

{
  int iVar1;
  pthread_t __thread1;
  long errorCode;
  pthread_mutex_t *in_RDI;
  PaError result;
  PaHostApiTypeId hostApiType;
  
  hostApiType = paInDevelopment;
  paUtilErr_ = pthread_mutex_lock(in_RDI);
  if (paUtilErr_ != 0) {
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar1 != 0) {
      errorCode = (long)paUtilErr_;
      strerror(paUtilErr_);
      PaUtil_SetLastHostErrorInfo(hostApiType,errorCode,(char *)0x112f77);
    }
    PaUtil_DebugPrint(
                     "Expression \'pthread_mutex_lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 527\n"
                     );
    hostApiType = 0xffffd8f1;
  }
  return hostApiType;
}

Assistant:

PaError PaUnixMutex_Lock( PaUnixMutex* self )
{
    PaError result = paNoError;
    
#ifdef PTHREAD_CANCEL
	int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, &oldState ), 0 );
#endif
    PA_ENSURE_SYSTEM( pthread_mutex_lock( &self->mtx ), 0 );

error:
    return result;
}